

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::ColorPickerOptionsPopup(float *ref_col,ImGuiColorEditFlags flags)

{
  undefined1 auVar1 [16];
  float item_width;
  ImGuiContext *pIVar2;
  bool bVar3;
  ulong uVar4;
  int picker_type;
  int int_id;
  uint flags_00;
  float fVar5;
  undefined1 auVar6 [64];
  ImVec2 backup_pos;
  ImVec2 picker_size;
  ImVec2 local_50;
  ImVec2 local_48;
  float local_40 [3];
  undefined1 auStack_34 [4];
  undefined1 extraout_var [56];
  
  if (((flags & 0x6000000U) == 0 || (flags & 0x10002U) == 0) &&
     (bVar3 = BeginPopup("context",0), pIVar2 = GImGui, bVar3)) {
    if ((flags & 0x6000000U) == 0) {
      item_width = GImGui->FontSize * 8.0;
      fVar5 = GetFrameHeight();
      auVar1 = vmaxss_avx(ZEXT416((uint)(item_width - (fVar5 + (pIVar2->Style).ItemInnerSpacing.x)))
                          ,ZEXT416(0x3f800000));
      local_48.y = auVar1._0_4_;
      local_48.x = item_width;
      PushItemWidth(item_width);
      int_id = 0;
      do {
        if ((int_id == 1) && (GImGui->CurrentWindow->SkipItems == false)) {
          SeparatorEx(((GImGui->CurrentWindow->DC).LayoutType == 0) + 5);
        }
        PushID(int_id);
        flags_00 = (uint)(int_id == 1) * 0x4000000 + ((uint)(int_id == 0) << 0x19 | flags & 2U) +
                   0x1a8;
        auVar6._0_8_ = GetCursorScreenPos();
        auVar6._8_56_ = extraout_var;
        local_50 = (ImVec2)vmovlps_avx(auVar6._0_16_);
        bVar3 = Selectable("##selectable",false,0,&local_48);
        if (bVar3) {
          pIVar2->ColorEditOptions = flags_00 & 0x6000000 | pIVar2->ColorEditOptions & 0xf9ffffffU;
        }
        SetCursorScreenPos(&local_50);
        uVar4 = (ulong)((flags_00 & 2) == 0);
        memset(auStack_34 + uVar4 * 4,0,(ulong)((flags_00 & 2) * 2));
        memcpy(local_40,ref_col,uVar4 * 4 + 0xc);
        ColorPicker4("##previewing_picker",local_40,flags_00,(float *)0x0);
        PopID();
        int_id = int_id + 1;
      } while (int_id == 1);
      PopItemWidth();
    }
    if ((flags & 0x10002U) == 0) {
      if (((flags & 0x6000000U) == 0) && (GImGui->CurrentWindow->SkipItems == false)) {
        SeparatorEx(((GImGui->CurrentWindow->DC).LayoutType == 0) + 5);
      }
      CheckboxFlagsT<int>("Alpha Bar",&pIVar2->ColorEditOptions,0x10000);
    }
    EndPopup();
  }
  return;
}

Assistant:

void ImGui::ColorPickerOptionsPopup(const float* ref_col, ImGuiColorEditFlags flags)
{
    bool allow_opt_picker = !(flags & ImGuiColorEditFlags__PickerMask);
    bool allow_opt_alpha_bar = !(flags & ImGuiColorEditFlags_NoAlpha) && !(flags & ImGuiColorEditFlags_AlphaBar);
    if ((!allow_opt_picker && !allow_opt_alpha_bar) || !BeginPopup("context"))
        return;
    ImGuiContext& g = *GImGui;
    if (allow_opt_picker)
    {
        ImVec2 picker_size(g.FontSize * 8, ImMax(g.FontSize * 8 - (GetFrameHeight() + g.Style.ItemInnerSpacing.x), 1.0f)); // FIXME: Picker size copied from main picker function
        PushItemWidth(picker_size.x);
        for (int picker_type = 0; picker_type < 2; picker_type++)
        {
            // Draw small/thumbnail version of each picker type (over an invisible button for selection)
            if (picker_type > 0) Separator();
            PushID(picker_type);
            ImGuiColorEditFlags picker_flags = ImGuiColorEditFlags_NoInputs | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoLabel | ImGuiColorEditFlags_NoSidePreview | (flags & ImGuiColorEditFlags_NoAlpha);
            if (picker_type == 0) picker_flags |= ImGuiColorEditFlags_PickerHueBar;
            if (picker_type == 1) picker_flags |= ImGuiColorEditFlags_PickerHueWheel;
            ImVec2 backup_pos = GetCursorScreenPos();
            if (Selectable("##selectable", false, 0, picker_size)) // By default, Selectable() is closing popup
                g.ColorEditOptions = (g.ColorEditOptions & ~ImGuiColorEditFlags__PickerMask) | (picker_flags & ImGuiColorEditFlags__PickerMask);
            SetCursorScreenPos(backup_pos);
            ImVec4 previewing_ref_col;
            memcpy(&previewing_ref_col, ref_col, sizeof(float) * ((picker_flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4));
            ColorPicker4("##previewing_picker", &previewing_ref_col.x, picker_flags);
            PopID();
        }
        PopItemWidth();
    }
    if (allow_opt_alpha_bar)
    {
        if (allow_opt_picker) Separator();
        CheckboxFlags("Alpha Bar", &g.ColorEditOptions, ImGuiColorEditFlags_AlphaBar);
    }
    EndPopup();
}